

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.cpp
# Opt level: O3

bool CombinePSBTs(PartiallySignedTransaction *out,
                 vector<PartiallySignedTransaction,_std::allocator<PartiallySignedTransaction>_>
                 *psbtxs)

{
  long lVar1;
  _Optional_payload_base<CMutableTransaction> *__other;
  PartiallySignedTransaction *pPVar2;
  bool bVar3;
  PartiallySignedTransaction *psbt;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __other = *(_Optional_payload_base<CMutableTransaction> **)psbtxs;
  std::_Optional_payload_base<CMutableTransaction>::_M_copy_assign
            ((_Optional_payload_base<CMutableTransaction> *)out,__other);
  std::
  _Rb_tree<KeyOriginInfo,_std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>,_std::_Select1st<std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>_>,_std::less<KeyOriginInfo>,_std::allocator<std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>_>_>
  ::operator=(&(out->m_xpubs)._M_t,
              (_Rb_tree<KeyOriginInfo,_std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>,_std::_Select1st<std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>_>,_std::less<KeyOriginInfo>,_std::allocator<std::pair<const_KeyOriginInfo,_std::set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_>_>_>_>
               *)(__other + 1));
  std::vector<PSBTInput,_std::allocator<PSBTInput>_>::operator=
            (&out->inputs,
             (vector<PSBTInput,_std::allocator<PSBTInput>_> *)((long)&__other[1]._M_payload + 0x30))
  ;
  std::vector<PSBTOutput,_std::allocator<PSBTOutput>_>::operator=
            (&out->outputs,
             (vector<PSBTOutput,_std::allocator<PSBTOutput>_> *)
             &__other[2]._M_payload._M_value.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
              _M_impl.super__Vector_impl_data._M_finish);
  std::
  _Rb_tree<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::operator=(&(out->unknown)._M_t,
              (_Rb_tree<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
               *)&__other[2]._M_payload._M_value.vout.
                  super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                  super__Vector_impl_data._M_finish);
  (out->m_version).super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int> =
       (_Optional_payload_base<unsigned_int>)
       __other[3]._M_payload._M_value.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  std::
  _Rb_tree<PSBTProprietary,_PSBTProprietary,_std::_Identity<PSBTProprietary>,_std::less<PSBTProprietary>,_std::allocator<PSBTProprietary>_>
  ::operator=(&(out->m_proprietary)._M_t,
              (_Rb_tree<PSBTProprietary,_PSBTProprietary,_std::_Identity<PSBTProprietary>,_std::less<PSBTProprietary>,_std::allocator<PSBTProprietary>_>
               *)&__other[3]._M_payload._M_value.vout);
  psbt = *(PartiallySignedTransaction **)psbtxs;
  do {
    psbt = psbt + 1;
    pPVar2 = *(PartiallySignedTransaction **)(psbtxs + 8);
    if (psbt == pPVar2) break;
    bVar3 = PartiallySignedTransaction::Merge(out,psbt);
  } while (bVar3);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return psbt == pPVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool CombinePSBTs(PartiallySignedTransaction& out, const std::vector<PartiallySignedTransaction>& psbtxs)
{
    out = psbtxs[0]; // Copy the first one

    // Merge
    for (auto it = std::next(psbtxs.begin()); it != psbtxs.end(); ++it) {
        if (!out.Merge(*it)) {
            return false;
        }
    }
    return true;
}